

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.cpp
# Opt level: O0

void duckdb_zstd::ZSTD_initDCtx_internal(ZSTD_DCtx *dctx)

{
  int iVar1;
  ZSTD_DCtx *in_RDI;
  
  in_RDI->staticSize = 0;
  in_RDI->ddict = (ZSTD_DDict *)0x0;
  in_RDI->ddictLocal = (ZSTD_DDict *)0x0;
  in_RDI->dictEnd = (void *)0x0;
  in_RDI->ddictIsCold = 0;
  in_RDI->dictUses = ZSTD_dont_use;
  in_RDI->inBuff = (char *)0x0;
  in_RDI->inBuffSize = 0;
  in_RDI->outBuffSize = 0;
  in_RDI->streamStage = zdss_init;
  in_RDI->noForwardProgress = 0;
  in_RDI->oversizedDuration = 0;
  in_RDI->isFrameDecompression = 1;
  iVar1 = ZSTD_cpuSupportsBmi2();
  in_RDI->bmi2 = iVar1;
  in_RDI->ddictSet = (ZSTD_DDictHashSet *)0x0;
  ZSTD_DCtx_resetParameters(in_RDI);
  return;
}

Assistant:

static void ZSTD_initDCtx_internal(ZSTD_DCtx* dctx)
{
    dctx->staticSize  = 0;
    dctx->ddict       = NULL;
    dctx->ddictLocal  = NULL;
    dctx->dictEnd     = NULL;
    dctx->ddictIsCold = 0;
    dctx->dictUses = ZSTD_dont_use;
    dctx->inBuff      = NULL;
    dctx->inBuffSize  = 0;
    dctx->outBuffSize = 0;
    dctx->streamStage = zdss_init;
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
    dctx->legacyContext = NULL;
    dctx->previousLegacyVersion = 0;
#endif
    dctx->noForwardProgress = 0;
    dctx->oversizedDuration = 0;
    dctx->isFrameDecompression = 1;
#if DYNAMIC_BMI2
    dctx->bmi2 = ZSTD_cpuSupportsBmi2();
#endif
    dctx->ddictSet = NULL;
    ZSTD_DCtx_resetParameters(dctx);
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    dctx->dictContentEndForFuzzing = NULL;
#endif
}